

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O0

void world_draw(world_t *world_p,graphical_context_t *context_p)

{
  camera_t *camera_p;
  mat4f_t m0;
  vec3d_t v0;
  vec3d_t v0_00;
  mat4f_t m0_00;
  mat4f_t m0_01;
  vec3d_t v1;
  mat4f_t m1;
  mat4f_t m1_00;
  vec3f_t v0_01;
  _Bool _Var1;
  vec3f_t vVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 local_20c;
  vec3f_t camera_position;
  float local_1f8;
  mat4f_t local_1f0;
  mat4f_t local_1b0;
  undefined1 local_170 [8];
  mat4f_t matrix;
  float local_128;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined1 local_104 [8];
  vec3f_t displacement;
  frustum_t frustum;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  mat4f_t camera_matrix;
  graphical_context_t *context_p_local;
  world_t *world_p_local;
  
  camera_p = context_p->camera_p;
  camera_matrix._56_8_ = context_p;
  context_p_local = (graphical_context_t *)world_p;
  camera_calculate_view_relative((mat4f_t *)((long)&frustum.field_0.front_side + 8),camera_p);
  uVar4 = *(undefined8 *)((long)&camera_p->projection + 0x30);
  m0_00._56_8_ = frustum._88_8_;
  m0_00._0_56_ = *(undefined1 (*) [56])((long)&camera_p->projection + 8);
  m1._8_8_ = local_88;
  m1._0_8_ = uStack_90;
  m1._16_8_ = uStack_80;
  m1._24_8_ = local_78;
  m1._32_8_ = uStack_70;
  m1._40_8_ = local_68;
  m1._48_8_ = uStack_60;
  m1._56_8_ = in_stack_fffffffffffffda8;
  mat4f_mul(m0_00,m1);
  frustum_create((frustum_t *)&displacement.field_0.y,(mat4f_t *)auStack_58);
  uVar3 = *(undefined8 *)(*(long *)camera_matrix._56_8_ + 0x40);
  v0.field_0.z = (double)uVar3;
  v0._0_16_ = *(undefined1 (*) [16])&context_p_local[0x40].voxel_shader_program;
  v1.field_0.z = (double)uVar4;
  v1._0_16_ = *(undefined1 (*) [16])(*(long *)camera_matrix._56_8_ + 0x48);
  vec3d_sub(v0,v1);
  v0_00.field_0.y = (double)local_110;
  v0_00.field_0.x = (double)uStack_118;
  v0_00.field_0.z = (double)uVar3;
  vVar2 = vec3d_f(v0_00);
  local_128 = vVar2.field_0.z;
  matrix._56_8_ = vVar2._0_8_;
  local_104 = (undefined1  [8])matrix._56_8_;
  displacement.field_0.x = local_128;
  _Var1 = frustum_box_in((frustum_t *)&displacement.field_0.y,(vec3f_t *)local_104,4.0);
  if (_Var1) {
    mat4f_set(&local_1f0,1.0);
    local_1f8 = displacement.field_0.x;
    camera_position._4_8_ = local_104;
    v0_01.field_0.z = displacement.field_0.x;
    v0_01._0_8_ = local_104;
    m0._8_8_ = local_1f0._8_8_;
    m0._0_8_ = local_1f0._0_8_;
    m0._16_8_ = local_1f0._16_8_;
    m0._24_8_ = local_1f0._24_8_;
    m0._32_8_ = local_1f0._32_8_;
    m0._40_8_ = local_1f0._40_8_;
    m0._48_8_ = local_1f0._48_8_;
    m0._56_8_ = local_1f0._56_8_;
    mat4f_translate(&local_1b0,m0,v0_01);
    m0_01._8_8_ = camera_matrix._8_8_;
    m0_01._0_8_ = camera_matrix._0_8_;
    m0_01._16_8_ = camera_matrix._16_8_;
    m0_01._24_8_ = camera_matrix._24_8_;
    m0_01._32_8_ = camera_matrix._32_8_;
    m0_01._40_8_ = camera_matrix._40_8_;
    m0_01._48_8_ = camera_matrix._48_8_;
    m0_01._56_8_ = local_1b0._0_8_;
    m1_00._8_8_ = local_1b0._16_8_;
    m1_00._0_8_ = local_1b0._8_8_;
    m1_00._16_8_ = local_1b0._24_8_;
    m1_00._24_8_ = local_1b0._32_8_;
    m1_00._32_8_ = local_1b0._40_8_;
    m1_00._40_8_ = local_1b0._48_8_;
    m1_00._48_8_ = local_1b0._56_8_;
    m1_00._56_8_ = in_stack_fffffffffffffda8;
    mat4f_mul(m0_01,m1_00);
    vVar2.field_0.z = displacement.field_0.x;
    vVar2._0_8_ = local_104;
    vVar2 = vec3f_negative(vVar2);
    camera_position.field_0.x = vVar2.field_0.z;
    local_20c = vVar2._0_8_;
    shader_program_uniform_matrix_4fv(*(GLuint *)(camera_matrix._56_8_ + 8),"matrix_mvp",local_170);
    shader_program_uniform3fv(*(GLuint *)(camera_matrix._56_8_ + 8),"camera_position",&local_20c);
    chunk_draw((chunk_t *)(context_p_local + 0x40));
  }
  return;
}

Assistant:

void world_draw(
        world_t*             world_p,
        graphical_context_t* context_p)
{
    const mat4f_t camera_matrix = mat4f_mul(
            context_p->camera_p->projection,
            camera_calculate_view_relative(context_p->camera_p));

    frustum_t frustum;
    frustum_create(&frustum, &camera_matrix);
    
    const vec3f_t displacement = vec3d_f(vec3d_sub(
            world_p->chunk.position,
            context_p->camera_p->position));

    if (frustum_box_in(&frustum, &displacement, CHUNK_HALF_SIZE))
    {
        const mat4f_t matrix = mat4f_mul(
                camera_matrix,
                mat4f_translate(mat4f_set(1.0f), displacement));

        const vec3f_t camera_position = vec3f_negative(displacement);

        shader_program_uniform_matrix_4fv(
                context_p->voxel_shader_program,
                "matrix_mvp",
                matrix.pointer);

        shader_program_uniform3fv(
                context_p->voxel_shader_program, 
                "camera_position",
                camera_position.pointer);

        chunk_draw(&world_p->chunk);
    }
}